

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVcreate_terminal_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVstone EVar1;
  CMFormat format;
  FMStructDescList handler_00;
  EVSimpleHandlerFunc client_data_00;
  char *in_RDX;
  EVSimpleHandlerFunc handler;
  FMStructDescList format_list;
  CMFormat f;
  EVstone ret;
  EVcreate_terminal_action_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffa8;
  CManager_conflict in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  format = CMlookup_format(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format((CManager)0x0,(FMStructDescList)in_stack_ffffffffffffffb0);
  }
  handler_00 = REVPlookup_format_structs
                         ((CManager_conflict)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDX);
  client_data_00 = REVPlookup_handler((char *)format);
  EVar1 = EVcreate_terminal_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (FMStructDescList)format,(EVSimpleHandlerFunc)handler_00,client_data_00);
  CMwrite((CMConnection)CONCAT44(EVar1,in_stack_ffffffffffffffc0),format,handler_00);
  return;
}

Assistant:

static void
REVcreate_terminal_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVcreate_terminal_action_request *request = (EVcreate_terminal_action_request *) data;
    EVstone ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    FMStructDescList format_list = REVPlookup_format_structs(conn->cm, request->format_list);
    EVSimpleHandlerFunc handler = REVPlookup_handler(request->handler);
    ret = EVcreate_terminal_action(cm, format_list, handler, NULL);
    response.ret = (int)ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}